

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

LY_ERR lyd_move_nodes_by_schema(lyd_node **first_dst,lyd_node *first_src)

{
  ly_bool lVar1;
  LY_ERR LVar2;
  ly_ctx *local_50;
  LY_ERR ret___1;
  LY_ERR ret__;
  lyd_node *leader;
  lyd_node *iter;
  lyd_node *next;
  lyd_node *plStack_20;
  LY_ERR ret;
  lyd_node *first_src_local;
  lyd_node **first_dst_local;
  
  plStack_20 = first_src;
  first_src_local = (lyd_node *)first_dst;
  if (((((first_dst == (lyd_node **)0x0) || (*first_dst == (lyd_node *)0x0)) ||
       ((*first_dst)->prev->next != (lyd_node *)0x0)) ||
      ((first_src == (lyd_node *)0x0 || (first_src->prev->next != (lyd_node *)0x0)))) ||
     (leader = first_src, first_src->parent != (lyd_node_inner *)0x0)) {
    __assert_fail("first_dst && *first_dst && !(*first_dst)->prev->next && first_src && !first_src->prev->next && !first_src->parent"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                  ,0x3a0,"LY_ERR lyd_move_nodes_by_schema(struct lyd_node **, struct lyd_node *)");
  }
  do {
    if (leader == (lyd_node *)0x0) {
      return LY_SUCCESS;
    }
    lVar1 = lyds_is_supported(leader);
    if ((lVar1 == '\0') ||
       (LVar2 = lyd_find_sibling_schema
                          (*(lyd_node **)first_src_local,leader->schema,(lyd_node **)&ret___1),
       LVar2 != LY_SUCCESS)) {
      LVar2 = lyd_move_nodes_ordby_schema((lyd_node **)first_src_local,leader,&iter);
joined_r0x0013449f:
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
    }
    else {
      next._4_4_ = lyds_merge((lyd_node **)first_src_local,(lyd_node **)&ret___1,
                              &stack0xffffffffffffffe0,leader,&iter);
      if (next._4_4_ != LY_SUCCESS) {
        if (plStack_20->schema == (lysc_node *)0x0) {
          local_50 = (ly_ctx *)plStack_20[2].schema;
        }
        else {
          local_50 = plStack_20->schema->module->ctx;
        }
        ly_log(local_50,LY_LLWRN,LY_SUCCESS,"Data in \"%s\" are not sorted.",_ret___1->schema->name)
        ;
        LVar2 = lyd_move_nodes_ordby_schema((lyd_node **)first_src_local,iter,&iter);
        goto joined_r0x0013449f;
      }
    }
    leader = iter;
  } while( true );
}

Assistant:

static LY_ERR
lyd_move_nodes_by_schema(struct lyd_node **first_dst, struct lyd_node *first_src)
{
    LY_ERR ret;
    struct lyd_node *next, *iter, *leader;

    assert(first_dst && *first_dst && !(*first_dst)->prev->next && first_src &&
            !first_src->prev->next && !first_src->parent);

    for (iter = first_src; iter; iter = next) {
        if (lyds_is_supported(iter) &&
                (lyd_find_sibling_schema(*first_dst, iter->schema, &leader) == LY_SUCCESS)) {
            ret = lyds_merge(first_dst, &leader, &first_src, iter, &next);
            if (ret) {
                /* The operation on the sorting tree unexpectedly failed due to some internal issue,
                 * but insert the node anyway although the nodes will not be sorted.
                 */
                LOGWRN(LYD_CTX(first_src), "Data in \"%s\" are not sorted.", leader->schema->name);
                LY_CHECK_RET(lyd_move_nodes_ordby_schema(first_dst, next, &next));
            }
        } else {
            LY_CHECK_RET(lyd_move_nodes_ordby_schema(first_dst, iter, &next));
        }
    }

    return LY_SUCCESS;
}